

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# credits.c
# Opt level: O3

void destroy_credits(void)

{
  CREDIT_NAME *pCVar1;
  CREDIT_NAME *__ptr;
  
  pCVar1 = cred;
  __ptr = credits;
  if ((title_text != (char *)0x0) && ((title_alloced & 1) != 0)) {
    free(title_text);
    pCVar1 = cred;
    __ptr = credits;
  }
  while (__ptr != (CREDIT_NAME *)0x0) {
    credits = __ptr->next;
    if (__ptr->name != (char *)0x0) {
      free(__ptr->name);
    }
    if (__ptr->text != (char *)0x0) {
      free(__ptr->text);
    }
    free(__ptr);
    pCVar1 = __ptr;
    __ptr = credits;
  }
  cred = pCVar1;
  credits = __ptr;
  return;
}

Assistant:

void destroy_credits(void)
{
   if ((title_text) && (title_alloced)) {
      free(title_text);
   }

   while (credits) {
      cred = credits;
      credits = cred->next;

      if (cred->name) {
         free(cred->name);
      }

      if (cred->text) {
         free(cred->text);
      }

      free(cred);
   }
}